

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OPL3.cpp
# Opt level: O3

void __thiscall Channel4op::keyOn(Channel4op *this)

{
  double dVar1;
  Operator *pOVar2;
  Stage SVar3;
  Stage SVar4;
  double dVar5;
  double dVar6;
  
  pOVar2 = this->op1;
  SVar4 = OFF;
  SVar3 = OFF;
  if (0 < pOVar2->ar) {
    dVar5 = log(-(pOVar2->envelopeGenerator).envelope);
    dVar1 = (pOVar2->envelopeGenerator).xMinimumInAttack;
    dVar6 = dVar5 * 1.4426950408889634;
    if (dVar1 <= dVar5 * 1.4426950408889634) {
      dVar6 = dVar1;
    }
    (pOVar2->envelopeGenerator).x = dVar6;
    (pOVar2->phaseGenerator).phase = 0.0;
    SVar3 = ATTACK;
  }
  (pOVar2->envelopeGenerator).stage = SVar3;
  pOVar2 = this->op2;
  if (0 < pOVar2->ar) {
    dVar5 = log(-(pOVar2->envelopeGenerator).envelope);
    dVar1 = (pOVar2->envelopeGenerator).xMinimumInAttack;
    dVar6 = dVar5 * 1.4426950408889634;
    if (dVar1 <= dVar5 * 1.4426950408889634) {
      dVar6 = dVar1;
    }
    (pOVar2->envelopeGenerator).x = dVar6;
    (pOVar2->phaseGenerator).phase = 0.0;
    SVar4 = ATTACK;
  }
  (pOVar2->envelopeGenerator).stage = SVar4;
  pOVar2 = this->op3;
  SVar4 = OFF;
  SVar3 = OFF;
  if (0 < pOVar2->ar) {
    dVar5 = log(-(pOVar2->envelopeGenerator).envelope);
    dVar1 = (pOVar2->envelopeGenerator).xMinimumInAttack;
    dVar6 = dVar5 * 1.4426950408889634;
    if (dVar1 <= dVar5 * 1.4426950408889634) {
      dVar6 = dVar1;
    }
    (pOVar2->envelopeGenerator).x = dVar6;
    (pOVar2->phaseGenerator).phase = 0.0;
    SVar3 = ATTACK;
  }
  (pOVar2->envelopeGenerator).stage = SVar3;
  pOVar2 = this->op4;
  if (0 < pOVar2->ar) {
    dVar5 = log(-(pOVar2->envelopeGenerator).envelope);
    dVar1 = (pOVar2->envelopeGenerator).xMinimumInAttack;
    dVar6 = dVar5 * 1.4426950408889634;
    if (dVar1 <= dVar5 * 1.4426950408889634) {
      dVar6 = dVar1;
    }
    (pOVar2->envelopeGenerator).x = dVar6;
    (pOVar2->phaseGenerator).phase = 0.0;
    SVar4 = ATTACK;
  }
  (pOVar2->envelopeGenerator).stage = SVar4;
  (this->super_Channel).feedback[0] = 0.0;
  (this->super_Channel).feedback[1] = 0.0;
  return;
}

Assistant:

void Channel4op::keyOn() {
	op1->keyOn();
	op2->keyOn();
	op3->keyOn();
	op4->keyOn();
	feedback[0] = feedback[1] = 0;
}